

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  ParenthesizedExpressionSyntax *args_2;
  CastExpressionSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = (ParenthesizedExpressionSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CastExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_30,args_2);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CastExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CastExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.apostrophe.deepClone(alloc),
        *deepClone<ParenthesizedExpressionSyntax>(*node.right, alloc)
    );
}